

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listing.cpp
# Opt level: O0

void listing(char *lst_filename,list<ast::Statement_*,_std::allocator<ast::Statement_*>_> *ast_root)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  reference ppSVar4;
  reference pvVar5;
  failure *e;
  string local_298 [32];
  string local_278 [8];
  string line;
  Statement *statement;
  Statement *s;
  iterator __end1;
  iterator __begin1;
  list<ast::Statement_*,_std::allocator<ast::Statement_*>_> *__range1;
  time_t now;
  int current_line;
  ostream local_218 [8];
  ofstream lst;
  list<ast::Statement_*,_std::allocator<ast::Statement_*>_> *ast_root_local;
  char *lst_filename_local;
  
  std::ofstream::ofstream(local_218,lst_filename,0x10);
  now._0_4_ = 1;
  __range1 = (list<ast::Statement_*,_std::allocator<ast::Statement_*>_> *)time((time_t *)0x0);
  poVar2 = std::operator<<(local_218,"P16 assembler v1.5 (Apr 26 2025)\t");
  poVar2 = std::operator<<(poVar2,lst_filename);
  poVar2 = std::operator<<(poVar2,'\t');
  pcVar3 = ctime((time_t *)&__range1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  ast::Sections::listing(local_218);
  ast::Symbols::listing(local_218);
  poVar2 = std::operator<<(local_218,"Code listing");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end1 = std::__cxx11::list<ast::Statement_*,_std::allocator<ast::Statement_*>_>::begin(ast_root);
  s = (Statement *)
      std::__cxx11::list<ast::Statement_*,_std::allocator<ast::Statement_*>_>::end(ast_root);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&s);
    if (!bVar1) break;
    ppSVar4 = std::_List_iterator<ast::Statement_*>::operator*(&__end1);
    line.field_2._8_8_ = *ppSVar4;
    std::__cxx11::string::string(local_278);
    for (; (int)(uint)now < *(int *)(line.field_2._8_8_ + 0x30); now._0_4_ = (uint)now + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&srcfile_abi_cxx11_,(long)(int)((uint)now - 1));
      std::__cxx11::string::operator=(local_278,(string *)pvVar5);
      poVar2 = ostream_printf(local_218,"%4d%11c\t",(ulong)(uint)now,0x20);
      poVar2 = std::operator<<(poVar2,local_278);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&srcfile_abi_cxx11_,(long)(int)((uint)now - 1));
    std::__cxx11::string::operator=(local_278,(string *)pvVar5);
    (**(code **)(*(long *)line.field_2._8_8_ + 0x20))(local_298);
    poVar2 = std::operator<<(local_218,local_298);
    poVar2 = std::operator<<(poVar2,local_278);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_298);
    (**(code **)(*(long *)line.field_2._8_8_ + 0x28))(&e);
    std::operator<<(local_218,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    now._0_4_ = (uint)now + 1;
    std::__cxx11::string::~string(local_278);
    std::_List_iterator<ast::Statement_*>::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void listing(const char *lst_filename, std::list<Statement*> *ast_root)
{
	try {
		std::ofstream lst (lst_filename);
		int current_line = 1;
		std::time_t now = std::time(0);
		lst << "P16 assembler v" VERSION " (" __DATE__ ")\t"
			<< lst_filename << '\t' << ctime(&now) << endl;

		Sections::listing(lst);
		Symbols::listing(lst);

		lst << "Code listing" << endl;
		for (auto s: *ast_root) {
			Statement *statement = s;
			std::string line;
			for (; current_line < statement->location.line; ++current_line) {
			//	linhas em branco e comentários
				line = srcfile[current_line - 1];
				ostream_printf(lst, "%4d%11c\t", current_line, ' ') << line << endl;
			}
			line = srcfile[current_line - 1];
			lst << statement->listing() << line << endl;
			lst << statement->more_listing();
			current_line++;
		}
		lst.close();
	} catch (std::ios_base::failure& e) {
		std::cerr << "IO exception: " << e.what() << endl;
	}
}